

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O1

void __thiscall Rml::ElementBackgroundBorder::Render(ElementBackgroundBorder *this,Element *element)

{
  _Base_ptr p_Var1;
  Vector2f VVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Texture texture;
  CompiledShader local_78;
  undefined1 local_68 [16];
  Mesh local_58;
  
  if ((this->background_dirty != false) || (this->border_dirty == true)) {
    p_Var3 = (this->backgrounds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(this->backgrounds)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var5) {
      do {
        if (p_Var3[1]._M_color != _S_red) {
          Geometry::Release(&local_58,(Geometry *)&p_Var3[1]._M_parent,ReturnMesh);
          if (local_58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_58.indices.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.indices.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_58.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.vertices.
                            super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_58.vertices.
                                  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.vertices.
                                  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        p_Var3 = (_Base_ptr)::std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var5);
    }
    GenerateGeometry(this,element);
    this->background_dirty = false;
    this->border_dirty = false;
  }
  p_Var5 = &(this->backgrounds)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->backgrounds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = p_Var1;
  p_Var4 = &p_Var5->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < 1]) {
    if (0 < (int)p_Var3[1]._M_color) {
      p_Var4 = p_Var3;
    }
  }
  p_Var3 = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var5) && (p_Var3 = p_Var4, 1 < (int)p_Var4[1]._M_color)) {
    p_Var3 = &p_Var5->_M_header;
  }
  p_Var4 = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var3 == p_Var5) || (*(int *)&p_Var3[1]._M_left == -1)) {
    for (; p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[p_Var1[1]._M_color >> 0x1f]) {
      if (-1 < (int)p_Var1[1]._M_color) {
        p_Var4 = p_Var1;
      }
    }
    p_Var3 = &p_Var5->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var5) && (p_Var3 = p_Var4, 0 < (int)p_Var4[1]._M_color)) {
      p_Var3 = &p_Var5->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 != p_Var5) {
      VVar2 = Element::GetAbsoluteOffset(element,Border);
      local_78.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager =
           (RenderManager *)0x0;
      local_78.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle =
           0;
      Geometry::Render((Geometry *)&p_Var3[1]._M_parent,VVar2,
                       (Texture)(ZEXT816(0xffffffffffffffff) << 0x40),&local_78);
      CompiledShader::Release(&local_78);
    }
  }
  else {
    VVar2 = Element::GetAbsoluteOffset(element,Border);
    local_68._8_4_ = extraout_XMM0_Dc;
    local_68._0_4_ = VVar2.x;
    local_68._4_4_ = VVar2.y;
    local_68._12_4_ = extraout_XMM0_Dd;
    texture = CallbackTexture::operator_cast_to_Texture((CallbackTexture *)&p_Var3[1]._M_right);
    local_78.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager =
         (RenderManager *)0x0;
    local_78.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle = 0
    ;
    Geometry::Render((Geometry *)&p_Var3[1]._M_parent,(Vector2f)local_68._0_8_,texture,&local_78);
    CompiledShader::Release(&local_78);
  }
  return;
}

Assistant:

void ElementBackgroundBorder::Render(Element* element)
{
	if (background_dirty || border_dirty)
	{
		for (auto& background : backgrounds)
		{
			if (background.first != BackgroundType::BackgroundBorder)
				background.second.geometry.Release();
		}

		GenerateGeometry(element);

		background_dirty = false;
		border_dirty = false;
	}

	Background* shadow = GetBackground(BackgroundType::BoxShadow);
	if (shadow && shadow->geometry)
		shadow->geometry.Render(element->GetAbsoluteOffset(BoxArea::Border), shadow->texture);
	else if (Background* background = GetBackground(BackgroundType::BackgroundBorder))
	{
		auto offset = element->GetAbsoluteOffset(BoxArea::Border);
		background->geometry.Render(offset);
	}
}